

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_hash_table.hpp
# Opt level: O0

bool __thiscall
poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>::find_item_
          (compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *this,
          uint64_t *slot_id,uint64_t quo)

{
  bool bVar1;
  compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *pcVar2;
  uint64_t uVar3;
  compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *in_RDX;
  uint64_t *in_RSI;
  uint64_t in_RDI;
  
  do {
    pcVar2 = (compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *)
             get_quo_(in_RDX,in_RDI);
    if (pcVar2 == in_RDX) {
      return true;
    }
    uVar3 = right_(in_RDX,in_RDI);
    *in_RSI = uVar3;
    bVar1 = get_cbit_(in_RDX,in_RDI);
  } while (((bVar1 ^ 0xffU) & 1) != 0);
  return false;
}

Assistant:

bool find_item_(uint64_t& slot_id, uint64_t quo) const {
        do {
            if (get_quo_(slot_id) == quo) {
                return true;
            }
            slot_id = right_(slot_id);
        } while (!get_cbit_(slot_id));
        return false;
    }